

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_a_star.cpp
# Opt level: O2

void __thiscall
IDAStarSearch::extend_frontier(IDAStarSearch *this,shared_ptr<Node> *node,int max_value)

{
  int iVar1;
  element_type *peVar2;
  int iVar3;
  bool bVar4;
  iterator iVar5;
  int iVar6;
  long lVar7;
  Maze *this_00;
  int new_y;
  int new_x;
  int new_value;
  int new_cost;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  shared_ptr<Node> local_58;
  Maze *local_48;
  deque<std::shared_ptr<Node>,std::allocator<std::shared_ptr<Node>>> *local_40;
  IDAStarSearch *local_38;
  
  this_00 = &(this->super_Search).maze;
  local_40 = (deque<std::shared_ptr<Node>,std::allocator<std::shared_ptr<Node>>> *)&this->frontier;
  local_64 = max_value;
  local_48 = this_00;
  local_38 = this;
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 4) {
    peVar2 = (node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_68 = peVar2->x + *(int *)((long)&DAT_00105060 + lVar7);
    local_6c = peVar2->y + *(int *)((long)&DAT_00105070 + lVar7);
    bVar4 = Maze::is_valid_coordinate(this_00,local_68,local_6c);
    if (bVar4) {
      local_58.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = local_6c;
      local_58.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = local_68;
      iVar5 = std::
              _Hashtable<std::pair<int,_int>,_std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<int,_int>_>,_PointHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(this->super_Search).visited_points._M_h,(key_type *)&local_58);
      if (iVar5.super__Node_iterator_base<std::pair<int,_int>,_true>._M_cur == (__node_type *)0x0) {
        iVar1 = (((node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->field_4).
                disc_cost;
        local_5c = iVar1 + 1;
        iVar6 = local_68 - (local_38->super_Search).target.first;
        iVar3 = -iVar6;
        if (0 < iVar6) {
          iVar3 = iVar6;
        }
        iVar6 = local_6c - (local_38->super_Search).target.second;
        local_60 = -iVar6;
        if (0 < iVar6) {
          local_60 = iVar6;
        }
        local_60 = local_60 + iVar1 + iVar3 + 1;
        if (local_60 <= local_64) {
          std::make_shared<Node,std::shared_ptr<Node>&,int&,int&,int&,int&>
                    (&local_58,(int *)node,&local_68,&local_6c,&local_60);
          std::deque<std::shared_ptr<Node>,std::allocator<std::shared_ptr<Node>>>::
          emplace_back<std::shared_ptr<Node>>(local_40,&local_58);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_58.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          this_00 = local_48;
        }
      }
    }
  }
  return;
}

Assistant:

void IDAStarSearch::extend_frontier(shared_ptr<Node> node, int max_value) {
    // right, left, down, up
    const int delta_xs[] = {0, 0, 1, -1};
    const int delta_ys[] = {1, -1, 0, 0};
    for (int i = 0; i < 4; ++i) {
        auto dx = delta_xs[i];
        auto dy = delta_ys[i];
        int new_x = node->x + dx;
        int new_y = node->y + dy;
        if (not maze.is_valid_coordinate(new_x, new_y)) continue;
        if (visited_points.find(make_pair(new_x, new_y)) != visited_points.end()) continue;
        auto new_cost = node->disc_cost + 1;
        auto new_value = get_evaluation(new_x, new_y, new_cost);
        if (new_value <= max_value) frontier.emplace_back(make_shared<Node>(node, new_x, new_y, new_value, new_cost));
    }
}